

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_migrate.cpp
# Opt level: O2

Dist * Omega_h::get_new_copies2old_owners
                 (Dist *__return_storage_ptr__,Dist *uses2old_owners,GOs *old_owner_globals)

{
  LOs old_owners2items;
  Dist old_owners2uniq_uses;
  Write<int> WStack_158;
  undefined1 local_148 [160];
  Dist local_a8;
  
  Dist::Dist(&local_a8,uses2old_owners);
  get_old_owners2uniq_uses((Dist *)(local_148 + 0x10),&local_a8);
  Dist::~Dist(&local_a8);
  Dist::roots2items((Dist *)local_148);
  Write<long>::Write(&WStack_158,(Write<int> *)old_owner_globals);
  Dist::set_dest_globals((Dist *)(local_148 + 0x10),(GOs *)&WStack_158);
  Write<long>::~Write((Write<long> *)&WStack_158);
  Dist::invert(__return_storage_ptr__,(Dist *)(local_148 + 0x10));
  Write<int>::~Write((Write<int> *)local_148);
  Dist::~Dist((Dist *)(local_148 + 0x10));
  return __return_storage_ptr__;
}

Assistant:

Dist get_new_copies2old_owners(Dist uses2old_owners, GOs old_owner_globals) {
  auto old_owners2uniq_uses = get_old_owners2uniq_uses(uses2old_owners);
  auto old_owners2items = old_owners2uniq_uses.roots2items();
  old_owners2uniq_uses.set_dest_globals(old_owner_globals);
  auto uniq_uses2old_owners = old_owners2uniq_uses.invert();
  return uniq_uses2old_owners;
}